

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# eodata.cpp
# Opt level: O2

uint __thiscall EIF::GetKey(EIF *this,int keynum)

{
  pointer pEVar1;
  ulong uVar2;
  size_t i;
  ulong uVar3;
  ulong uVar4;
  
  pEVar1 = (this->data).super__Vector_base<EIF_Data_Base<EIF>,_std::allocator<EIF_Data_Base<EIF>_>_>
           ._M_impl.super__Vector_impl_data._M_start;
  uVar2 = ((long)(this->data).
                 super__Vector_base<EIF_Data_Base<EIF>,_std::allocator<EIF_Data_Base<EIF>_>_>.
                 _M_impl.super__Vector_impl_data._M_finish - (long)pEVar1) / 0x70;
  uVar3 = 0;
  while( true ) {
    if (uVar2 == uVar3) {
      return 0;
    }
    uVar4 = uVar3 & 0xffffffff;
    if (uVar2 <= (uVar3 & 0xffffffff)) {
      uVar4 = 0;
    }
    if ((pEVar1[uVar4].type == Key) && (pEVar1[uVar4].field_25.scrollmap == keynum)) break;
    uVar3 = uVar3 + 1;
  }
  return (uint)uVar3;
}

Assistant:

unsigned int EIF::GetKey(int keynum) const
{
	for (std::size_t i = 0; i < this->data.size(); ++i)
	{
		if (this->Get(i).type == EIF::Key && this->Get(i).key == keynum)
			return i;
	}

	return 0;
}